

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnGlobalSymbol
          (BinaryReaderObjdump *this,Index index,uint32_t flags,string_view name,Index global_index)

{
  Result RVar1;
  
  if (name.size_ == 0) {
    name = BinaryReaderObjdumpBase::GetGlobalName(&this->super_BinaryReaderObjdumpBase,global_index)
    ;
  }
  PrintDetails(this,"   - %d: G <%.*s> global=%u",(ulong)index,name.size_ & 0xffffffff,name.data_,
               global_index);
  RVar1 = PrintSymbolFlags(this,flags);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderObjdump::OnGlobalSymbol(Index index,
                                           uint32_t flags,
                                           string_view name,
                                           Index global_index) {
  if (name.empty()) {
    name = GetGlobalName(global_index);
  }
  PrintDetails("   - %d: G <" PRIstringview "> global=%" PRIindex, index,
               WABT_PRINTF_STRING_VIEW_ARG(name), global_index);
  return PrintSymbolFlags(flags);
}